

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_0::CWriter::WriteFree(CWriter *this)

{
  bool bVar1;
  vector<wabt::Table_*,_std::allocator<wabt::Table_*>_> *this_00;
  reference ppTVar2;
  vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_> *this_01;
  reference ppMVar3;
  Newline local_c3;
  CloseBrace local_c2;
  Newline local_c1;
  ExternalInstancePtr local_c0;
  undefined1 local_a9;
  Memory *pMStack_a8;
  bool is_import_1;
  Memory *memory;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_> *__range2_1;
  Index memory_index;
  char *local_70;
  undefined1 local_61;
  Table *pTStack_60;
  bool is_import;
  Table *table;
  const_iterator __end2;
  const_iterator __begin2;
  vector<wabt::Table_*,_std::allocator<wabt::Table_*>_> *__range2;
  Index table_index;
  Newline local_11;
  CWriter *local_10;
  CWriter *this_local;
  
  local_10 = this;
  (anonymous_namespace)::CWriter::ModuleInstanceTypeName_abi_cxx11_
            ((string *)&table_index,(CWriter *)this);
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::Newline,char_const(&)[6],char_const(&)[8],std::__cxx11::string&,char_const(&)[7],std::__cxx11::string,char_const(&)[13],wabt::(anonymous_namespace)::OpenBrace>
            ((CWriter *)this,&local_11,(char (*) [6])"void ",(char (*) [8])"wasm2c_",
             &this->module_prefix_,(char (*) [7])"_free(",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&table_index,
             (char (*) [13])"* instance) ",(OpenBrace *)((long)&__range2 + 7));
  std::__cxx11::string::~string((string *)&table_index);
  __range2._0_4_ = 0;
  this_00 = &this->module_->tables;
  __end2 = std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::begin(this_00);
  table = (Table *)std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>::end(this_00);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<wabt::Table_*const_*,_std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>_>
                                *)&table);
    if (!bVar1) break;
    ppTVar2 = __gnu_cxx::
              __normal_iterator<wabt::Table_*const_*,_std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>_>
              ::operator*(&__end2);
    pTStack_60 = *ppTVar2;
    local_61 = (uint)__range2 < this->module_->num_table_imports;
    if (!(bool)local_61) {
      local_70 = GetReferenceTypeName(&pTStack_60->elem_type);
      ExternalInstancePtr::GlobalName((ExternalInstancePtr *)&memory_index,Table,&pTStack_60->name);
      (anonymous_namespace)::CWriter::
      Write<char_const(&)[14],char_const*,char_const(&)[8],wabt::(anonymous_namespace)::ExternalInstancePtr,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(char (*) [14])"wasm_rt_free_",&local_70,(char (*) [8])"_table(",
                 (ExternalInstancePtr *)&memory_index,(char (*) [3])0x221bfb,
                 (Newline *)((long)&__range2_1 + 7));
    }
    __range2._0_4_ = (uint)__range2 + 1;
    __gnu_cxx::
    __normal_iterator<wabt::Table_*const_*,_std::vector<wabt::Table_*,_std::allocator<wabt::Table_*>_>_>
    ::operator++(&__end2);
  }
  __range2_1._0_4_ = 0;
  this_01 = &this->module_->memories;
  __end2_1 = std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::begin(this_01);
  memory = (Memory *)std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>::end(this_01);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2_1,
                       (__normal_iterator<wabt::Memory_*const_*,_std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>_>
                        *)&memory);
    if (!bVar1) break;
    ppMVar3 = __gnu_cxx::
              __normal_iterator<wabt::Memory_*const_*,_std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>_>
              ::operator*(&__end2_1);
    pMStack_a8 = *ppMVar3;
    local_a9 = (uint)__range2_1 < this->module_->num_memory_imports;
    if (!(bool)local_a9) {
      ExternalInstancePtr::GlobalName(&local_c0,Memory,&pMStack_a8->name);
      (anonymous_namespace)::CWriter::
      Write<char_const(&)[21],wabt::(anonymous_namespace)::ExternalInstancePtr,char_const(&)[3],wabt::(anonymous_namespace)::Newline>
                ((CWriter *)this,(char (*) [21])"wasm_rt_free_memory(",&local_c0,
                 (char (*) [3])0x221bfb,&local_c1);
    }
    __range2_1._0_4_ = (uint)__range2_1 + 1;
    __gnu_cxx::
    __normal_iterator<wabt::Memory_*const_*,_std::vector<wabt::Memory_*,_std::allocator<wabt::Memory_*>_>_>
    ::operator++(&__end2_1);
  }
  (anonymous_namespace)::CWriter::
  Write<wabt::(anonymous_namespace)::CloseBrace,wabt::(anonymous_namespace)::Newline>
            ((CWriter *)this,&local_c2,&local_c3);
  return;
}

Assistant:

void CWriter::WriteFree() {
  Write(Newline(), "void ", kAdminSymbolPrefix, module_prefix_, "_free(",
        ModuleInstanceTypeName(), "* instance) ", OpenBrace());

  {
    Index table_index = 0;
    for (const Table* table : module_->tables) {
      bool is_import = table_index < module_->num_table_imports;
      if (!is_import) {
        Write("wasm_rt_free_", GetReferenceTypeName(table->elem_type),
              "_table(",
              ExternalInstancePtr(ModuleFieldType::Table, table->name), ");",
              Newline());
      }
      ++table_index;
    }
  }

  {
    Index memory_index = 0;
    for (const Memory* memory : module_->memories) {
      bool is_import = memory_index < module_->num_memory_imports;
      if (!is_import) {
        Write("wasm_rt_free_memory(",
              ExternalInstancePtr(ModuleFieldType::Memory, memory->name), ");",
              Newline());
      }
      ++memory_index;
    }
  }

  Write(CloseBrace(), Newline());
}